

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O2

void __thiscall
TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_>::AddItem
          (TPZDohrPrecondV2SubDataList<double,_TPZDohrSubstructCondense<double>_> *this,
          TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_> *data)

{
  std::mutex::lock(&this->fAccessLock);
  std::__cxx11::
  list<TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>,_std::allocator<TPZDohrPrecondV2SubData<double,_TPZDohrSubstructCondense<double>_>_>_>
  ::push_back(&this->fWork,data);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void AddItem(TPZDohrPrecondV2SubData<TVar, TSubStruct> &data)
	{
        std::lock_guard<std::mutex> lock(fAccessLock);
	  fWork.push_back(data);
	}